

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O0

char * make_dirname(char *pi_name,char **logtext)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  char *dirname_00;
  char *pcVar4;
  int *piVar5;
  char *pcVar6;
  ssize_t sVar7;
  char *pcVar8;
  ssh_hash *h_00;
  char *local_178;
  ssh_hash *h;
  char retbuf [65];
  byte local_d8 [8];
  uchar digest [32];
  int pid;
  char *tmpname;
  uint local_98;
  int ret;
  int i;
  int saltfd;
  char *saltname;
  uchar saltbuf [64];
  char *err;
  char *dirname;
  char *parentdirname;
  char *name;
  char **logtext_local;
  char *pi_name_local;
  
  dirname_00 = make_parentdir_name();
  pcVar4 = make_dir_and_check_ours(dirname_00);
  if (pcVar4 != (char *)0x0) {
    *logtext = pcVar4;
    safefree(dirname_00);
    return (char *)0x0;
  }
  pcVar4 = dupprintf("%s/%s",dirname_00,"salt");
  ret = open(pcVar4,0);
  if (ret < 0) {
    piVar5 = __errno_location();
    if (*piVar5 != 2) {
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      pcVar6 = dupprintf("%s: open: %s",pcVar4,pcVar6);
      *logtext = pcVar6;
      safefree(pcVar4);
      safefree(dirname_00);
      return (char *)0x0;
    }
    uVar1 = getpid();
    local_98 = 0;
    while( true ) {
      pcVar6 = dupprintf("%s/%s.tmp.%d.%d",dirname_00,"salt",(ulong)uVar1,(ulong)local_98);
      iVar2 = open(pcVar6,0xc1,0x100);
      if (-1 < iVar2) break;
      piVar5 = __errno_location();
      if (*piVar5 != 0x11) {
        piVar5 = __errno_location();
        pcVar8 = strerror(*piVar5);
        pcVar8 = dupprintf("%s: open: %s",pcVar6,pcVar8);
        *logtext = pcVar8;
        safefree(pcVar6);
        safefree(pcVar4);
        safefree(dirname_00);
        return (char *)0x0;
      }
      safefree(pcVar6);
      local_98 = local_98 + 1;
    }
    random_read(&saltname,0x40);
    sVar7 = write(iVar2,&saltname,0x40);
    iVar3 = (int)sVar7;
    if ((-1 < iVar3) && (iVar3 != 0x40)) {
      __assert_fail("ret < 0 || ret == SALT_SIZE",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/sharing.c"
                    ,0x80,"char *make_dirname(const char *, char **)");
    }
    if (iVar3 < 0) {
      close(iVar2);
      piVar5 = __errno_location();
      pcVar8 = strerror(*piVar5);
      pcVar8 = dupprintf("%s: write: %s",pcVar6,pcVar8);
      *logtext = pcVar8;
      safefree(pcVar6);
      safefree(pcVar4);
      safefree(dirname_00);
      return (char *)0x0;
    }
    iVar2 = close(iVar2);
    if (iVar2 < 0) {
      piVar5 = __errno_location();
      pcVar8 = strerror(*piVar5);
      pcVar8 = dupprintf("%s: close: %s",pcVar6,pcVar8);
      *logtext = pcVar8;
      safefree(pcVar6);
      safefree(pcVar4);
      safefree(dirname_00);
      return (char *)0x0;
    }
    iVar2 = link(pcVar6,pcVar4);
    if ((iVar2 < 0) && (piVar5 = __errno_location(), *piVar5 != 0x11)) {
      piVar5 = __errno_location();
      pcVar8 = strerror(*piVar5);
      pcVar8 = dupprintf("%s: link: %s",pcVar4,pcVar8);
      *logtext = pcVar8;
      safefree(pcVar6);
      safefree(pcVar4);
      safefree(dirname_00);
      return (char *)0x0;
    }
    iVar2 = unlink(pcVar6);
    if (iVar2 < 0) {
      piVar5 = __errno_location();
      pcVar8 = strerror(*piVar5);
      pcVar8 = dupprintf("%s: unlink: %s",pcVar6,pcVar8);
      *logtext = pcVar8;
      safefree(pcVar6);
      safefree(pcVar4);
      safefree(dirname_00);
      return (char *)0x0;
    }
    safefree(pcVar6);
    ret = open(pcVar4,0);
    if (ret < 0) {
      piVar5 = __errno_location();
      pcVar6 = strerror(*piVar5);
      pcVar6 = dupprintf("%s: open: %s",pcVar4,pcVar6);
      *logtext = pcVar6;
      safefree(pcVar4);
      safefree(dirname_00);
      return (char *)0x0;
    }
  }
  local_98 = 0;
  while( true ) {
    if (0x3f < (int)local_98) {
      close(ret);
      safefree(pcVar4);
      h_00 = ssh_hash_new(&ssh_sha256);
      BinarySink_put_string(h_00->binarysink_,&saltname,0x40);
      BinarySink_put_stringz(h_00->binarysink_,pi_name);
      ssh_hash_final(h_00,local_d8);
      for (local_98 = 0; (int)local_98 < 0x20; local_98 = local_98 + 1) {
        sprintf(retbuf + (long)(int)(local_98 << 1) + -8,"%02x",(ulong)local_d8[(int)local_98]);
      }
      pcVar4 = dupstr((char *)&h);
      smemclr(&saltname,0x40);
      pcVar6 = dupprintf("%s/%s",dirname_00,pcVar4);
      safefree(dirname_00);
      safefree(pcVar4);
      return pcVar6;
    }
    sVar7 = read(ret,&saltname,0x40);
    iVar2 = (int)sVar7;
    if (iVar2 < 1) break;
    if ((iVar2 < 1) || ((int)(0x40 - local_98) < iVar2)) {
      __assert_fail("0 < ret && ret <= SALT_SIZE - i",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/sharing.c"
                    ,0xcb,"char *make_dirname(const char *, char **)");
    }
    local_98 = iVar2 + local_98 + 1;
  }
  close(ret);
  if (iVar2 == 0) {
    local_178 = "unexpected EOF";
  }
  else {
    piVar5 = __errno_location();
    local_178 = strerror(*piVar5);
  }
  pcVar6 = dupprintf("%s: read: %s",pcVar4,local_178);
  *logtext = pcVar6;
  safefree(pcVar4);
  safefree(dirname_00);
  return (char *)0x0;
}

Assistant:

static char *make_dirname(const char *pi_name, char **logtext)
{
    char *name, *parentdirname, *dirname, *err;

    /*
     * First, create the top-level directory for all shared PuTTY
     * connections owned by this user.
     */
    parentdirname = make_parentdir_name();
    if ((err = make_dir_and_check_ours(parentdirname)) != NULL) {
        *logtext = err;
        sfree(parentdirname);
        return NULL;
    }

    /*
     * Transform the platform-independent version of the connection
     * identifier into the name we'll actually use for the directory
     * containing the Unix socket.
     *
     * We do this by hashing the identifier with some user-specific
     * secret information, to avoid the privacy leak of having
     * "user@host" strings show up in 'netstat -x'. (Irritatingly, the
     * full pathname of a Unix-domain socket _does_ show up in the
     * 'netstat -x' output, at least on Linux, even if that socket is
     * in a directory not readable to the user running netstat. You'd
     * think putting things inside an 0700 directory would hide their
     * names from other users, but no.)
     *
     * The secret information we use to salt the hash lives in a file
     * inside the top-level directory we just created, so we must
     * first create that file (with some fresh random data in it) if
     * it's not already been done by a previous PuTTY.
     */
    {
        unsigned char saltbuf[SALT_SIZE];
        char *saltname;
        int saltfd, i, ret;

        saltname = dupprintf("%s/%s", parentdirname, SALT_FILENAME);
        saltfd = open(saltname, O_RDONLY);
        if (saltfd < 0) {
            char *tmpname;
            int pid;

            if (errno != ENOENT) {
                *logtext = dupprintf("%s: open: %s", saltname,
                                     strerror(errno));
                sfree(saltname);
                sfree(parentdirname);
                return NULL;
            }

            /*
             * The salt file doesn't already exist, so try to create
             * it. Another process may be attempting the same thing
             * simultaneously, so we must do this carefully: we write
             * a salt file under a different name, then hard-link it
             * into place, which guarantees that we won't change the
             * contents of an existing salt file.
             */
            pid = getpid();
            for (i = 0;; i++) {
                tmpname = dupprintf("%s/%s.tmp.%d.%d",
                                    parentdirname, SALT_FILENAME, pid, i);
                saltfd = open(tmpname, O_WRONLY | O_EXCL | O_CREAT, 0400);
                if (saltfd >= 0)
                    break;
                if (errno != EEXIST) {
                    *logtext = dupprintf("%s: open: %s", tmpname,
                                         strerror(errno));
                    sfree(tmpname);
                    sfree(saltname);
                    sfree(parentdirname);
                    return NULL;
                }
                sfree(tmpname);        /* go round and try again with i+1 */
            }
            /*
             * Invent some random data.
             */
            random_read(saltbuf, SALT_SIZE);
            ret = write(saltfd, saltbuf, SALT_SIZE);
            /* POSIX atomicity guarantee: because we wrote less than
             * PIPE_BUF bytes, the write either completed in full or
             * failed. */
            assert(SALT_SIZE < PIPE_BUF);
            assert(ret < 0 || ret == SALT_SIZE);
            if (ret < 0) {
                close(saltfd);
                *logtext = dupprintf("%s: write: %s", tmpname,
                                     strerror(errno));
                sfree(tmpname);
                sfree(saltname);
                sfree(parentdirname);
                return NULL;
            }
            if (close(saltfd) < 0) {
                *logtext = dupprintf("%s: close: %s", tmpname,
                                     strerror(errno));
                sfree(tmpname);
                sfree(saltname);
                sfree(parentdirname);
                return NULL;
            }

            /*
             * Now attempt to hard-link our temp file into place. We
             * tolerate EEXIST as an outcome, because that just means
             * another PuTTY got their attempt in before we did (and
             * we only care that there is a valid salt file we can
             * agree on, no matter who created it).
             */
            if (link(tmpname, saltname) < 0 && errno != EEXIST) {
                *logtext = dupprintf("%s: link: %s", saltname,
                                     strerror(errno));
                sfree(tmpname);
                sfree(saltname);
                sfree(parentdirname);
                return NULL;
            }

            /*
             * Whether that succeeded or not, get rid of our temp file.
             */
            if (unlink(tmpname) < 0) {
                *logtext = dupprintf("%s: unlink: %s", tmpname,
                                     strerror(errno));
                sfree(tmpname);
                sfree(saltname);
                sfree(parentdirname);
                return NULL;
            }

            /*
             * And now we've arranged for there to be a salt file, so
             * we can try to open it for reading again and this time
             * expect it to work.
             */
            sfree(tmpname);

            saltfd = open(saltname, O_RDONLY);
            if (saltfd < 0) {
                *logtext = dupprintf("%s: open: %s", saltname,
                                     strerror(errno));
                sfree(saltname);
                sfree(parentdirname);
                return NULL;
            }
        }

        for (i = 0; i < SALT_SIZE; i++) {
            ret = read(saltfd, saltbuf, SALT_SIZE);
            if (ret <= 0) {
                close(saltfd);
                *logtext = dupprintf("%s: read: %s", saltname,
                                     ret == 0 ? "unexpected EOF" :
                                     strerror(errno));
                sfree(saltname);
                sfree(parentdirname);
                return NULL;
            }
            assert(0 < ret && ret <= SALT_SIZE - i);
            i += ret;
        }

        close(saltfd);
        sfree(saltname);

        /*
         * Now we've got our salt, hash it with the connection
         * identifier to produce our actual socket name.
         */
        {
            unsigned char digest[32];
            char retbuf[65];

            ssh_hash *h = ssh_hash_new(&ssh_sha256);
            put_string(h, saltbuf, SALT_SIZE);
            put_stringz(h, pi_name);
            ssh_hash_final(h, digest);

            /*
             * And make it printable.
             */
            for (i = 0; i < 32; i++) {
                sprintf(retbuf + 2*i, "%02x", digest[i]);
                /* the last of those will also write the trailing NUL */
            }

            name = dupstr(retbuf);
        }

        smemclr(saltbuf, sizeof(saltbuf));
    }

    dirname = dupprintf("%s/%s", parentdirname, name);
    sfree(parentdirname);
    sfree(name);

    return dirname;
}